

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O1

void __thiscall
Js::FunctionExecutionStateMachine::CommitExecutedIterations
          (FunctionExecutionStateMachine *this,uint16 *limit,uint executedIterations)

{
  code *pcVar1;
  bool bVar2;
  Type TVar3;
  undefined4 *puVar4;
  ushort uVar5;
  uint uVar6;
  
  if (this->initializedExecutionModeAndLimits == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x31e,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar2) goto LAB_0078bf2a;
    *puVar4 = 0;
  }
  if ((&this->profilingInterpreter1Limit != limit && &this->simpleJitLimit != limit) &&
      ((&this->autoProfilingInterpreter1Limit != limit && &this->profilingInterpreter0Limit != limit
       ) && (&this->autoProfilingInterpreter0Limit != limit && &this->interpreterLimit != limit))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x325,
                                "(&limit == &interpreterLimit || &limit == &autoProfilingInterpreter0Limit || &limit == &profilingInterpreter0Limit || &limit == &autoProfilingInterpreter1Limit || &limit == &simpleJitLimit || &limit == &profilingInterpreter1Limit)"
                                ,
                                "&limit == &interpreterLimit || &limit == &autoProfilingInterpreter0Limit || &limit == &profilingInterpreter0Limit || &limit == &autoProfilingInterpreter1Limit || &limit == &simpleJitLimit || &limit == &profilingInterpreter1Limit"
                               );
    if (!bVar2) goto LAB_0078bf2a;
    *puVar4 = 0;
  }
  uVar6 = (uint)*limit;
  if (executedIterations < *limit) {
    uVar6 = executedIterations;
  }
  uVar5 = (ushort)uVar6;
  if (this->fullJitThreshold < uVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x328,"(fullJitThreshold >= clampedExecutedIterations)",
                                "fullJitThreshold >= clampedExecutedIterations");
    if (!bVar2) {
LAB_0078bf2a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this->fullJitThreshold = this->fullJitThreshold - uVar5;
  *limit = *limit - uVar5;
  VerifyExecutionModeLimits(this);
  if ((&this->profilingInterpreter0Limit == limit) ||
     ((byte)(~DAT_015bbe4c & &this->simpleJitLimit == limit |
            &this->profilingInterpreter1Limit == limit) == 1)) {
    TVar3 = 0xffff;
    if (!CARRY2(uVar5,this->committedProfiledIterations)) {
      TVar3 = uVar5 + this->committedProfiledIterations;
    }
    this->committedProfiledIterations = TVar3;
  }
  return;
}

Assistant:

void FunctionExecutionStateMachine::CommitExecutedIterations(uint16 &limit, const uint executedIterations)
    {
        Assert(initializedExecutionModeAndLimits);
        Assert(
            &limit == &interpreterLimit ||
            &limit == &autoProfilingInterpreter0Limit ||
            &limit == &profilingInterpreter0Limit ||
            &limit == &autoProfilingInterpreter1Limit ||
            &limit == &simpleJitLimit ||
            &limit == &profilingInterpreter1Limit);

        const uint16 clampedExecutedIterations = executedIterations >= limit ? limit : static_cast<uint16>(executedIterations);
        Assert(fullJitThreshold >= clampedExecutedIterations);
        fullJitThreshold -= clampedExecutedIterations;
        limit -= clampedExecutedIterations;
        VerifyExecutionModeLimits();

        if (&limit == &profilingInterpreter0Limit ||
            (!CONFIG_FLAG(NewSimpleJit) && &limit == &simpleJitLimit) ||
            &limit == &profilingInterpreter1Limit)
        {
            const uint16 newCommittedProfiledIterations = committedProfiledIterations + clampedExecutedIterations;
            committedProfiledIterations =
                newCommittedProfiledIterations >= committedProfiledIterations ? newCommittedProfiledIterations : UINT16_MAX;
        }
    }